

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

int64_t __thiscall google::protobuf::io::StringOutputStream::ByteCount(StringOutputStream *this)

{
  int64_t iVar1;
  LogMessage *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff98;
  LogMessage local_40;
  
  if (in_RDI->filename_ == (char *)0x0) {
    this_00 = &local_40;
    internal::LogMessage::LogMessage
              (in_RDI,(LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20),(char *)this_00,
               in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x44b857);
  }
  iVar1 = std::__cxx11::string::size();
  return iVar1;
}

Assistant:

int64_t StringOutputStream::ByteCount() const {
  GOOGLE_CHECK(target_ != NULL);
  return target_->size();
}